

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

void Llb_ManGroupStop(Llb_Grp_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  
  if (p == (Llb_Grp_t *)0x0) {
    return;
  }
  iVar1 = p->Id;
  if ((-1 < (long)iVar1) && (pVVar2 = p->pMan->vGroups, iVar1 < pVVar2->nSize)) {
    pVVar2->pArray[iVar1] = (void *)0x0;
    Vec_PtrFreeP(&p->vIns);
    Vec_PtrFreeP(&p->vOuts);
    Vec_PtrFreeP(&p->vNodes);
    free(p);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Llb_ManGroupStop( Llb_Grp_t * p )
{
    if ( p == NULL )
        return;
    Vec_PtrWriteEntry( p->pMan->vGroups, p->Id, NULL );
    Vec_PtrFreeP( &p->vIns );
    Vec_PtrFreeP( &p->vOuts );
    Vec_PtrFreeP( &p->vNodes );
    ABC_FREE( p );
}